

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::SSDAtomVisitor::SSDAtomVisitor(SSDAtomVisitor *this,SimInfo *info)

{
  ReplacementVisitor *in_RDI;
  double in_stack_fffffffffffffd18;
  double in_stack_fffffffffffffd20;
  allocator<char> *y;
  string *in_stack_fffffffffffffd28;
  allocator<char> *x;
  ReplacementVisitor *in_stack_fffffffffffffd30;
  Vector3<double> *this_00;
  SimInfo *in_stack_fffffffffffffd48;
  ReplacementVisitor *in_stack_fffffffffffffd50;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Vector3d *refPos;
  string *name;
  Vector3d *in_stack_fffffffffffffd88;
  Vector3d *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  ReplacementVisitor *in_stack_fffffffffffffda0;
  allocator<char> local_241;
  string local_240 [63];
  allocator<char> local_201;
  string local_200 [63];
  undefined1 local_1c1 [64];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  undefined1 local_b9 [40];
  allocator<char> local_91;
  string local_90 [39];
  undefined1 local_69 [40];
  undefined1 local_41 [65];
  
  ReplacementVisitor::ReplacementVisitor(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  (in_RDI->super_BaseAtomVisitor).super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__SSDAtomVisitor_00481060;
  std::__cxx11::string::operator=
            ((string *)&(in_RDI->super_BaseAtomVisitor).super_BaseVisitor.visitorName,
             "SSDAtomVisitor");
  name = (string *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (allocator<char> *)in_stack_fffffffffffffd50);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  refPos = (Vector3d *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (allocator<char> *)in_stack_fffffffffffffd50);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (allocator<char> *)in_stack_fffffffffffffd50);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffd58,(allocator<char> *)in_stack_fffffffffffffd50);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  __s = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s,(allocator<char> *)in_stack_fffffffffffffd50);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  __a = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  ReplacementVisitor::addReplacedAtomName(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffd30,(double)in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  ReplacementVisitor::addSite(in_RDI,name,refPos);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  this_00 = (Vector3<double> *)local_1c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  Vector3<double>::Vector3
            (this_00,(double)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18);
  ReplacementVisitor::addSite(in_RDI,name,refPos);
  std::__cxx11::string::~string((string *)(local_1c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1c1);
  x = &local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  Vector3<double>::Vector3(this_00,(double)x,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  ReplacementVisitor::addSite(in_RDI,name,refPos);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  y = &local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  Vector3<double>::Vector3(this_00,(double)x,(double)y,in_stack_fffffffffffffd18);
  Vector3<double>::Vector3(this_00,(double)x,(double)y,in_stack_fffffffffffffd18);
  ReplacementVisitor::addSite
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  return;
}

Assistant:

SSDAtomVisitor(SimInfo* info) : ReplacementVisitor(info) {
      visitorName = "SSDAtomVisitor";

      /// these are the atom names we can replace with a fixed structure
      addReplacedAtomName("SSD");
      addReplacedAtomName("SSD_E");
      addReplacedAtomName("SSD_RF");
      addReplacedAtomName("SSD1");
      addReplacedAtomName("SSDQ");
      addReplacedAtomName("SSDQO");
      addReplacedAtomName("TAP");
      addReplacedAtomName("TRED");

      // this is the reference structure we'll use for the replacement:
      addSite("H", Vector3d(0.0, -0.75695, 0.5206));
      addSite("H", Vector3d(0.0, 0.75695, 0.5206));
      addSite("O", Vector3d(0.0, 0.0, -0.0654));
      addSite("X", Vector3d(0.0, 0.0, 0.0), Vector3d(0, 0, 1));
    }